

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O1

void __thiscall TasGrid::GridFourier::clearGpuCoefficients(GridFourier *this)

{
  CudaFourierData<double> *this_00;
  CudaFourierData<float> *this_01;
  
  this_00 = (this->gpu_cache)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaFourierData<double>_*,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
            .super__Head_base<0UL,_TasGrid::CudaFourierData<double>_*,_false>._M_head_impl;
  if (this_00 != (CudaFourierData<double> *)0x0) {
    GpuVector<double>::clear(&this_00->real);
    GpuVector<double>::clear
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaFourierData<double>_*,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaFourierData<double>_*,_false>._M_head_impl)->
                imag);
  }
  this_01 = (this->gpu_cachef)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaFourierData<float>,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaFourierData<float>_*,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
            .super__Head_base<0UL,_TasGrid::CudaFourierData<float>_*,_false>._M_head_impl;
  if (this_01 != (CudaFourierData<float> *)0x0) {
    GpuVector<float>::clear(&this_01->real);
    GpuVector<float>::clear
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaFourierData<float>,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaFourierData<float>_*,_std::default_delete<TasGrid::CudaFourierData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaFourierData<float>_*,_false>._M_head_impl)->
                imag);
    return;
  }
  return;
}

Assistant:

void GridFourier::clearGpuCoefficients() const{
    if (gpu_cache){
        gpu_cache->real.clear();
        gpu_cache->imag.clear();
    }
    if (gpu_cachef){
        gpu_cachef->real.clear();
        gpu_cachef->imag.clear();
    }
}